

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_swrenderer.cpp
# Opt level: O2

void __thiscall FSoftwareRenderer::PrecacheTexture(FSoftwareRenderer *this,FTexture *tex,int cache)

{
  Span *spanp;
  undefined1 auStack_8 [8];
  
  if (tex != (FTexture *)0x0) {
    if ((cache & 0xdU) == 0) {
      if (cache != 0) {
        (*tex->_vptr_FTexture[3])();
        return;
      }
      (*tex->_vptr_FTexture[9])(tex);
      return;
    }
    (*tex->_vptr_FTexture[2])(tex,0,auStack_8);
  }
  return;
}

Assistant:

void FSoftwareRenderer::PrecacheTexture(FTexture *tex, int cache)
{
	if (tex != NULL)
	{
		if (cache & FTextureManager::HIT_Columnmode)
		{
			const FTexture::Span *spanp;
			tex->GetColumn(0, &spanp);
		}
		else if (cache != 0)
		{
			tex->GetPixels ();
		}
		else
		{
			tex->Unload ();
		}
	}
}